

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

Function * __thiscall LLVMBC::Module::getFunction(Module *this,String *name)

{
  pointer ppFVar1;
  int iVar2;
  String *pSVar3;
  Function *pFVar4;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  pointer ppFVar8;
  
  ppFVar7 = (this->functions).
            super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (this->functions).
            super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)ppFVar1 - (long)ppFVar7;
  if (0 < lVar6 >> 5) {
    lVar5 = (lVar6 >> 5) + 1;
    ppFVar7 = ppFVar7 + 2;
    do {
      ppFVar8 = ppFVar7;
      pSVar3 = Function::getName_abi_cxx11_(ppFVar8[-2]);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) {
        ppFVar8 = ppFVar8 + -2;
        goto LAB_00185694;
      }
      pSVar3 = Function::getName_abi_cxx11_(ppFVar8[-1]);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) {
        ppFVar8 = ppFVar8 + -1;
        goto LAB_00185694;
      }
      pSVar3 = Function::getName_abi_cxx11_(*ppFVar8);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) goto LAB_00185694;
      pSVar3 = Function::getName_abi_cxx11_(ppFVar8[1]);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      if (iVar2 == 0) {
        ppFVar8 = ppFVar8 + 1;
        goto LAB_00185694;
      }
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x20;
      ppFVar7 = ppFVar8 + 4;
    } while (1 < lVar5);
    ppFVar7 = ppFVar8 + 2;
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      ppFVar8 = ppFVar1;
      if (lVar6 != 3) goto LAB_00185694;
      pSVar3 = Function::getName_abi_cxx11_(*ppFVar7);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              compare(pSVar3,name);
      ppFVar8 = ppFVar7;
      if (iVar2 == 0) goto LAB_00185694;
      ppFVar7 = ppFVar7 + 1;
    }
    pSVar3 = Function::getName_abi_cxx11_(*ppFVar7);
    iVar2 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            compare(pSVar3,name);
    ppFVar8 = ppFVar7;
    if (iVar2 == 0) goto LAB_00185694;
    ppFVar7 = ppFVar7 + 1;
  }
  pSVar3 = Function::getName_abi_cxx11_(*ppFVar7);
  iVar2 = std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::compare
                    (pSVar3,name);
  ppFVar8 = ppFVar7;
  if (iVar2 != 0) {
    ppFVar8 = ppFVar1;
  }
LAB_00185694:
  if (ppFVar8 ==
      (this->functions).
      super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = (Function *)0x0;
  }
  else {
    pFVar4 = *ppFVar8;
  }
  return pFVar4;
}

Assistant:

Function *Module::getFunction(const String &name) const
{
	auto itr =
	    std::find_if(functions.begin(), functions.end(), [&](const Function *func) { return func->getName() == name; });

	if (itr != functions.end())
		return *itr;
	else
		return nullptr;
}